

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseFlopStandard(Ver_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  Ver_Stream_t *p;
  char cVar1;
  int iVar2;
  char *pName;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pNetLI;
  
  p = pMan->pReader;
  iVar2 = Ver_ParseConvertNetwork(pMan,pNtk,pMan->fMapped);
  if (iVar2 == 0) {
    return 0;
  }
  cVar1 = Ver_StreamPopChar(p);
  if (cVar1 != '(') {
    builtin_strncpy(pMan->sError,"Cannot parse a standard gate (expected opening parenthesis).",0x3d
                   );
    goto LAB_002ede0f;
  }
  Ver_ParseSkipComments(pMan);
  pName = Ver_ParseGetName(pMan);
  if (pName == (char *)0x0) {
    return 0;
  }
  pAVar3 = Ver_ParseFindNet(pNtk,pName);
  if (pAVar3 == (Abc_Obj_t *)0x0) {
LAB_002eddf8:
    sprintf(pMan->sError,"Net is missing in gate %s.",pName);
  }
  else {
    Ver_ParseSkipComments(pMan);
    cVar1 = Ver_StreamPopChar(p);
    if (cVar1 == ',') {
      Ver_ParseSkipComments(pMan);
      pName = Ver_ParseGetName(pMan);
      if (pName == (char *)0x0) {
        return 0;
      }
      pNetLI = Ver_ParseFindNet(pNtk,pName);
      if (pNetLI == (Abc_Obj_t *)0x0) goto LAB_002eddf8;
      Ver_ParseSkipComments(pMan);
      cVar1 = Ver_StreamPopChar(p);
      if (cVar1 == ')') {
        Ver_ParseSkipComments(pMan);
        cVar1 = Ver_StreamPopChar(p);
        if (cVar1 == ';') {
          pAVar3 = Ver_ParseCreateLatch(pNtk,pNetLI,pAVar3);
          if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
            pAVar3->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
            return 1;
          }
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x1a3,"void Abc_LatchSetInit0(Abc_Obj_t *)");
        }
      }
    }
    builtin_strncpy(pMan->sError,"Cannot parse the flop.",0x17);
  }
LAB_002ede0f:
  Ver_ParsePrintErrorMessage(pMan);
  return 0;
}

Assistant:

int Ver_ParseFlopStandard( Ver_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    Ver_Stream_t * p = pMan->pReader;
    Abc_Obj_t * pNetLi, * pNetLo, * pLatch;
    char * pWord, Symbol;

    // convert from the blackbox into the network with local functions representated by AIGs
    if ( !Ver_ParseConvertNetwork( pMan, pNtk, pMan->fMapped ) )
        return 0;

    // this is gate name - throw it away
    if ( Ver_StreamPopChar(p) != '(' )
    {
        sprintf( pMan->sError, "Cannot parse a standard gate (expected opening parenthesis)." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    Ver_ParseSkipComments( pMan );

    // parse the output name
    pWord = Ver_ParseGetName( pMan );
    if ( pWord == NULL )
        return 0;
    // get the net corresponding to this output
    pNetLo = Ver_ParseFindNet( pNtk, pWord );
    if ( pNetLo == NULL )
    {
        sprintf( pMan->sError, "Net is missing in gate %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    Symbol = Ver_StreamPopChar(p);
    if ( Symbol == ')' )
    {
        sprintf( pMan->sError, "Cannot parse the flop." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    // skip comma
    if ( Symbol != ',' )
    {
        sprintf( pMan->sError, "Cannot parse the flop." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    Ver_ParseSkipComments( pMan );

    // parse the output name
    pWord = Ver_ParseGetName( pMan );
    if ( pWord == NULL )
        return 0;
    // get the net corresponding to this output
    pNetLi = Ver_ParseFindNet( pNtk, pWord );
    if ( pNetLi == NULL )
    {
        sprintf( pMan->sError, "Net is missing in gate %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    Symbol = Ver_StreamPopChar(p);
    if ( Symbol != ')' )
    {
        sprintf( pMan->sError, "Cannot parse the flop." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    if ( Ver_StreamPopChar(p) != ';' )
    {
        sprintf( pMan->sError, "Cannot parse the flop." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // create the latch
    pLatch = Ver_ParseCreateLatch( pNtk, pNetLi, pNetLo );
    Abc_LatchSetInit0( pLatch );
    return 1;
}